

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DLevelScript::DLevelScript(DLevelScript *this)

{
  bool bVar1;
  DACSThinker *this_00;
  size_t len;
  DLevelScript *this_local;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009f5968;
  TArray<int,_int>::TArray(&this->Localvars);
  TObjPtr<AActor>::TObjPtr(&this->activator);
  this->prev = (DLevelScript *)0x0;
  this->next = (DLevelScript *)0x0;
  len = 0;
  bVar1 = TObjPtr<DACSThinker>::operator==(&DACSThinker::ActiveThinker,(DACSThinker *)0x0);
  if (bVar1) {
    this_00 = (DACSThinker *)DObject::operator_new((DObject *)0x60,len);
    DACSThinker::DACSThinker(this_00);
  }
  this->activefont = SmallFont;
  return;
}

Assistant:

DLevelScript::DLevelScript ()
{
	next = prev = NULL;
	if (DACSThinker::ActiveThinker == NULL)
		new DACSThinker;
	activefont = SmallFont;
}